

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-shutdown-close.c
# Opt level: O2

void connect_cb(uv_connect_t *req,int status)

{
  uv_stream_t *stream;
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  uv_buf_t uVar6;
  size_t sStack_10040;
  uv_buf_t send_bufs [4096];
  
  stream = connect_req.handle;
  if (req == &connect_req) {
    if (status == 0) {
      connect_cb_called = connect_cb_called + 1;
      lVar4 = 0;
      do {
        if (lVar4 == 3) {
          sStack_10040 = 0x15987a;
          iVar1 = uv_shutdown(&shutdown_req,stream,shutdown_cb);
          if (iVar1 == 0) {
            sStack_10040 = 0x159894;
            iVar1 = uv_read_start(stream,alloc_cb,read_cb);
            if (iVar1 == 0) {
              return;
            }
            pcVar3 = "r == 0";
            sVar2 = 0x8f;
          }
          else {
            pcVar3 = "r == 0";
            sVar2 = 0x8b;
          }
          goto LAB_00159858;
        }
        for (lVar5 = 8; lVar5 != 0x10008; lVar5 = lVar5 + 0x10) {
          sStack_10040 = 0x1597f6;
          uVar6 = uv_buf_init(send_buffer + bytes_sent,0x2728);
          *(char **)((long)send_bufs + lVar5 + -8) = uVar6.base;
          *(size_t *)((long)&send_bufs[0].base + lVar5) = uVar6.len;
          bytes_sent = bytes_sent + 0x2728;
        }
        sStack_10040 = 0x15982d;
        iVar1 = uv_write(write_reqs + lVar4,stream,send_bufs,0x1000,write_cb);
        lVar4 = lVar4 + 1;
      } while (iVar1 == 0);
      pcVar3 = "r == 0";
      sVar2 = 0x86;
    }
    else {
      pcVar3 = "status == 0";
      sStack_10040 = 0x77;
      sVar2 = sStack_10040;
    }
  }
  else {
    pcVar3 = "req == &connect_req";
    sStack_10040 = 0x76;
    sVar2 = sStack_10040;
  }
LAB_00159858:
  sStack_10040 = 0x15985f;
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-writealot.c"
          ,sVar2,pcVar3);
  sStack_10040 = 0x159864;
  abort();
}

Assistant:

static void connect_cb(uv_connect_t* req, int status) {
  int r;

  ASSERT(req == &connect_req);
  ASSERT(status == 0);

  r = uv_shutdown(&shutdown_req, req->handle, shutdown_cb);
  ASSERT(r == 0);
  ASSERT(0 == uv_is_closing((uv_handle_t*) req->handle));
  uv_close((uv_handle_t*) req->handle, close_cb);
  ASSERT(1 == uv_is_closing((uv_handle_t*) req->handle));

  connect_cb_called++;
}